

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O1

void Diligent::
     FormatStrSS<std::__cxx11::stringstream,char[50],char_const*,char[16],char_const*,char[4],char[20],unsigned_int,char[31],unsigned_int,char[42],unsigned_int,char[10]>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               char (*FirstArg) [50],char **RestArgs,char (*RestArgs_1) [16],char **RestArgs_2,
               char (*RestArgs_3) [4],char (*RestArgs_4) [20],uint *RestArgs_5,
               char (*RestArgs_6) [31],uint *RestArgs_7,char (*RestArgs_8) [42],uint *RestArgs_9,
               char (*RestArgs_10) [10])

{
  size_t sVar1;
  
  sVar1 = strlen(*FirstArg);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(ss + 0x10),*FirstArg,sVar1);
  FormatStrSS<std::__cxx11::stringstream,char_const*>(ss,RestArgs);
  FormatStrSS<std::__cxx11::stringstream,char[16],char_const*,char[4],char[20],unsigned_int,char[31],unsigned_int,char[42],unsigned_int,char[10]>
            (ss,RestArgs_1,RestArgs_2,RestArgs_3,RestArgs_4,RestArgs_5,RestArgs_6,RestArgs_7,
             RestArgs_8,RestArgs_9,RestArgs_10);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const FirstArgType& FirstArg, const RestArgsType&... RestArgs)
{
    FormatStrSS(ss, FirstArg);
    FormatStrSS(ss, RestArgs...); // recursive call using pack expansion syntax
}